

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O1

string * __thiscall
ast::ReturnStmt::toString_abi_cxx11_(string *__return_storage_ptr__,ReturnStmt *this)

{
  ostringstream msg;
  long local_190 [14];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"return ",7);
  operator<<((ostream *)local_190,this->returnValue);
  std::ios::widen((char)(ostream *)local_190 + (char)*(undefined8 *)(local_190[0] + -0x18));
  std::ostream::put((char)local_190);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string ast::ReturnStmt::toString() const {
    std::ostringstream msg;
    msg << "return ";
    msg << returnValue;
    msg << std::endl;
    return msg.str();
}